

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O1

void __thiscall
pmx::PmxMorphMaterialOffset::Read(PmxMorphMaterialOffset *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  
  iVar1 = ReadIndex(stream,(uint)setting->material_index_size);
  this->material_index = iVar1;
  std::istream::read((char *)stream,(long)&this->offset_operation);
  std::istream::read((char *)stream,(long)this->diffuse);
  std::istream::read((char *)stream,(long)this->specular);
  std::istream::read((char *)stream,(long)&this->specularity);
  std::istream::read((char *)stream,(long)this->ambient);
  std::istream::read((char *)stream,(long)this->edge_color);
  std::istream::read((char *)stream,(long)&this->edge_size);
  std::istream::read((char *)stream,(long)this->texture_argb);
  std::istream::read((char *)stream,(long)this->sphere_texture_argb);
  std::istream::read((char *)stream,(long)this->toon_texture_argb);
  return;
}

Assistant:

void PmxMorphMaterialOffset::Read(std::istream *stream, PmxSetting *setting)
	{
		this->material_index = ReadIndex(stream, setting->material_index_size);
		stream->read((char*) &this->offset_operation, sizeof(uint8_t));
		stream->read((char*)this->diffuse, sizeof(float) * 4);
		stream->read((char*)this->specular, sizeof(float) * 3);
		stream->read((char*) &this->specularity, sizeof(float));
		stream->read((char*)this->ambient, sizeof(float) * 3);
		stream->read((char*)this->edge_color, sizeof(float) * 4);
		stream->read((char*) &this->edge_size, sizeof(float));
		stream->read((char*)this->texture_argb, sizeof(float) * 4);
		stream->read((char*)this->sphere_texture_argb, sizeof(float) * 4);
		stream->read((char*)this->toon_texture_argb, sizeof(float) * 4);
	}